

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

void __thiscall wasm::WasmBinaryWriter::writeElementSegments(WasmBinaryWriter *this)

{
  Module *wasm;
  pointer puVar1;
  ElementSegment *pEVar2;
  char *pcVar3;
  pointer ppEVar4;
  BufferWithRandomAccess *pBVar5;
  int32_t iVar6;
  uint32_t uVar7;
  uint uVar8;
  Table *pTVar9;
  mapped_type *pmVar10;
  _Base_ptr p_Var11;
  uint uVar12;
  size_t in_RCX;
  size_t __n;
  void *__buf;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar13;
  void *__buf_00;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *__buf_01;
  void *extraout_RDX_07;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  iterator __end3;
  pointer puVar14;
  iterator __begin3;
  pointer ppEVar15;
  long lVar16;
  bool bVar17;
  undefined1 local_90 [8];
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> needingElemDecl;
  LEB<unsigned_int,_unsigned_char> local_58;
  int32_t local_54;
  pointer local_50;
  undefined1 auStack_48 [8];
  Name name;
  
  wasm = this->wasm;
  puVar14 = (wasm->elementSegments).
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  puVar1 = (wasm->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  TableUtils::getFunctionsNeedingElemDeclare
            ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)local_90,wasm);
  lVar16 = (ulong)(CONCAT44(needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_header._M_right.
                            _4_4_,needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_header.
                                  _M_right._0_4_) != 0) + ((long)puVar14 - (long)puVar1 >> 3);
  if (lVar16 != 0) {
    iVar6 = startSection<wasm::BinaryConsts::Section>(this,Element);
    auStack_48._0_4_ = (int)lVar16;
    LEB<unsigned_int,_unsigned_char>::write
              ((LEB<unsigned_int,_unsigned_char> *)auStack_48,(int)this->o,__buf,in_RCX);
    puVar14 = (this->wasm->elementSegments).
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)(this->wasm->elementSegments).
                 super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    pvVar13 = extraout_RDX;
    local_54 = iVar6;
    if (puVar14 != (pointer)needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_node_count) {
      do {
        pEVar2 = (puVar14->_M_t).
                 super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                 .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        pcVar3 = *(char **)((long)&(pEVar2->table).super_IString + 8);
        name.super_IString.str._M_str._7_1_ = TableUtils::usesExpressions(pEVar2,this->wasm);
        local_50 = puVar14;
        if (pcVar3 == (char *)0x0) {
          uVar8 = (uint)name.super_IString.str._M_str._7_1_ << 2;
          uVar7 = 0;
          bVar17 = false;
          pvVar13 = extraout_RDX_00;
          uVar12 = uVar8;
        }
        else {
          uVar7 = getTableIndex(this,(Name)(((puVar14->_M_t).
                                             super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                             .super__Head_base<0UL,_wasm::ElementSegment_*,_false>.
                                            _M_head_impl)->table).super_IString.str);
          if (uVar7 == 0) {
            pTVar9 = Module::getTable(this->wasm,
                                      (Name)(((puVar14->_M_t).
                                              super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                              .super__Head_base<0UL,_wasm::ElementSegment_*,_false>.
                                             _M_head_impl)->table).super_IString.str);
            pvVar13 = (void *)(ulong)name.super_IString.str._M_str._7_1_;
            bVar17 = (pTVar9->type).id != 0x12;
            uVar8 = (uint)name.super_IString.str._M_str._7_1_ * 4 + 2;
            if (!bVar17) {
              uVar8 = (uint)name.super_IString.str._M_str._7_1_ * 4;
            }
            uVar7 = 0;
            uVar12 = (uint)name.super_IString.str._M_str._7_1_ * 4;
          }
          else {
            uVar8 = (uint)name.super_IString.str._M_str._7_1_ * 4 + 2;
            bVar17 = true;
            pvVar13 = extraout_RDX_01;
            uVar12 = (uint)name.super_IString.str._M_str._7_1_ << 2;
          }
        }
        uVar12 = uVar12 | 1;
        if (pcVar3 != (char *)0x0) {
          uVar12 = uVar8;
        }
        __n = (size_t)uVar12;
        auStack_48._0_4_ = uVar12;
        LEB<unsigned_int,_unsigned_char>::write
                  ((LEB<unsigned_int,_unsigned_char> *)auStack_48,(int)this->o,pvVar13,__n);
        pvVar13 = __buf_00;
        if (pcVar3 == (char *)0x0) {
LAB_00c6124d:
          if (name.super_IString.str._M_str._7_1_ == 0) {
            auStack_48 = (undefined1  [8])((ulong)auStack_48 & 0xffffffff00000000);
            LEB<unsigned_int,_unsigned_char>::write
                      ((LEB<unsigned_int,_unsigned_char> *)auStack_48,(int)this->o,pvVar13,__n);
            pvVar13 = extraout_RDX_04;
          }
          else {
            writeType(this,(Type)(((local_50->_M_t).
                                   super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                   .super__Head_base<0UL,_wasm::ElementSegment_*,_false>.
                                  _M_head_impl)->type).id);
            pvVar13 = extraout_RDX_03;
          }
        }
        else {
          if (bVar17) {
            auStack_48._0_4_ = uVar7;
            LEB<unsigned_int,_unsigned_char>::write
                      ((LEB<unsigned_int,_unsigned_char> *)auStack_48,(int)this->o,__buf_00,__n);
          }
          writeExpression(this,((local_50->_M_t).
                                super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)
                               ->offset);
          auStack_48[0] = 0xb;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                     (uchar *)auStack_48);
          pvVar13 = extraout_RDX_02;
          if (bVar17) goto LAB_00c6124d;
        }
        pEVar2 = (local_50->_M_t).
                 super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                 .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        in_RCX = (ulong)((long)*(pointer *)
                                ((long)&(pEVar2->data).
                                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                + 8) -
                        *(long *)&(pEVar2->data).
                                  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                  ._M_impl) >> 3;
        auStack_48._0_4_ = (int)in_RCX;
        LEB<unsigned_int,_unsigned_char>::write
                  ((LEB<unsigned_int,_unsigned_char> *)auStack_48,(int)this->o,pvVar13,in_RCX);
        pEVar2 = (local_50->_M_t).
                 super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                 .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        ppEVar15 = *(pointer *)
                    &(pEVar2->data).
                     super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                     _M_impl;
        ppEVar4 = *(pointer *)
                   ((long)&(pEVar2->data).
                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                   + 8);
        pvVar13 = extraout_RDX_05;
        if (name.super_IString.str._M_str._7_1_ == 0) {
          for (; ppEVar15 != ppEVar4; ppEVar15 = ppEVar15 + 1) {
            if ((*ppEVar15)->_id != RefFuncId) {
              __assert_fail("int(_id) == int(T::SpecificId)",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                            ,0x31b,"T *wasm::Expression::cast() [T = wasm::RefFunc]");
            }
            pBVar5 = this->o;
            uVar7 = getFunctionIndex(this,(IString)*(IString *)&(*ppEVar15)[1]._id);
            auStack_48._0_4_ = uVar7;
            LEB<unsigned_int,_unsigned_char>::write
                      ((LEB<unsigned_int,_unsigned_char> *)auStack_48,(int)pBVar5,__buf_01,in_RCX);
            pvVar13 = extraout_RDX_07;
          }
        }
        else {
          for (; ppEVar15 != ppEVar4; ppEVar15 = ppEVar15 + 1) {
            writeExpression(this,*ppEVar15);
            auStack_48[0] = 0xb;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                      (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                       (uchar *)auStack_48);
            pvVar13 = extraout_RDX_06;
          }
        }
        puVar14 = local_50 + 1;
      } while (puVar14 != (pointer)needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_node_count)
      ;
    }
    if (CONCAT44(needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_,
                 needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_) != 0)
    {
      auStack_48._0_4_ = 3;
      LEB<unsigned_int,_unsigned_char>::write
                ((LEB<unsigned_int,_unsigned_char> *)auStack_48,(int)this->o,pvVar13,in_RCX);
      auStack_48._0_4_ = 0;
      LEB<unsigned_int,_unsigned_char>::write
                ((LEB<unsigned_int,_unsigned_char> *)auStack_48,(int)this->o,__buf_02,in_RCX);
      auStack_48._0_4_ = needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_header._M_right._0_4_
      ;
      LEB<unsigned_int,_unsigned_char>::write
                ((LEB<unsigned_int,_unsigned_char> *)auStack_48,(int)this->o,__buf_03,in_RCX);
      if (needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
          (_Base_ptr)&needingElemDecl) {
        p_Var11 = needingElemDecl._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        do {
          auStack_48 = *(undefined1 (*) [8])(p_Var11 + 1);
          name.super_IString.str._M_len = (size_t)p_Var11[1]._M_parent;
          pBVar5 = this->o;
          pmVar10 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&this->indexes,(key_type *)auStack_48);
          local_58.value = *pmVar10;
          LEB<unsigned_int,_unsigned_char>::write(&local_58,(int)pBVar5,__buf_04,in_RCX);
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
        } while (p_Var11 != (_Rb_tree_node_base *)&needingElemDecl);
      }
    }
    finishSection(this,local_54);
  }
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)local_90);
  return;
}

Assistant:

void WasmBinaryWriter::writeElementSegments() {
  size_t elemCount = wasm->elementSegments.size();
  auto needingElemDecl = TableUtils::getFunctionsNeedingElemDeclare(*wasm);
  if (!needingElemDecl.empty()) {
    elemCount++;
  }
  if (elemCount == 0) {
    return;
  }

  auto start = startSection(BinaryConsts::Section::Element);
  o << U32LEB(elemCount);

  Type funcref = Type(HeapType::func, Nullable);
  for (auto& segment : wasm->elementSegments) {
    Index tableIdx = 0;

    bool isPassive = segment->table.isNull();
    // If the segment is MVP, we can use the shorter form.
    bool usesExpressions = TableUtils::usesExpressions(segment.get(), wasm);

    // The table index can and should be elided for active segments of table 0
    // when table 0 has type funcref. This was the only type of segment
    // supported by the MVP, which also did not support table indices in the
    // segment encoding.
    bool hasTableIndex = false;
    if (!isPassive) {
      tableIdx = getTableIndex(segment->table);
      hasTableIndex =
        tableIdx > 0 || wasm->getTable(segment->table)->type != funcref;
    }

    uint32_t flags = 0;
    if (usesExpressions) {
      flags |= BinaryConsts::UsesExpressions;
    }
    if (isPassive) {
      flags |= BinaryConsts::IsPassive;
    } else if (hasTableIndex) {
      flags |= BinaryConsts::HasIndex;
    }

    o << U32LEB(flags);
    if (!isPassive) {
      if (hasTableIndex) {
        o << U32LEB(tableIdx);
      }
      writeExpression(segment->offset);
      o << int8_t(BinaryConsts::End);
    }

    if (isPassive || hasTableIndex) {
      if (usesExpressions) {
        // elemType
        writeType(segment->type);
      } else {
        // MVP elemKind of funcref
        o << U32LEB(0);
      }
    }
    o << U32LEB(segment->data.size());
    if (usesExpressions) {
      for (auto* item : segment->data) {
        writeExpression(item);
        o << int8_t(BinaryConsts::End);
      }
    } else {
      for (auto& item : segment->data) {
        // We've ensured that all items are ref.func.
        auto& name = item->cast<RefFunc>()->func;
        o << U32LEB(getFunctionIndex(name));
      }
    }
  }

  if (!needingElemDecl.empty()) {
    o << U32LEB(BinaryConsts::IsPassive | BinaryConsts::IsDeclarative);
    o << U32LEB(0); // type (indicating funcref)
    o << U32LEB(needingElemDecl.size());
    for (auto name : needingElemDecl) {
      o << U32LEB(indexes.functionIndexes[name]);
    }
  }

  finishSection(start);
}